

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_psnr_enc.c
# Opt level: O2

double AccumulateSSE(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,int w,int h)

{
  uint32_t uVar1;
  int iVar2;
  bool bVar3;
  double dVar4;
  
  iVar2 = 0;
  if (0 < h) {
    iVar2 = h;
  }
  dVar4 = 0.0;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    uVar1 = (*VP8AccumulateSSE)(src,ref,w);
    dVar4 = dVar4 + (double)uVar1;
    src = src + src_stride;
    ref = ref + ref_stride;
  }
  return dVar4;
}

Assistant:

static double AccumulateSSE(const uint8_t* src, int src_stride,
                            const uint8_t* ref, int ref_stride,
                            int w, int h) {
  int y;
  double total_sse = 0.;
  for (y = 0; y < h; ++y) {
    total_sse += VP8AccumulateSSE(src, ref, w);
    src += src_stride;
    ref += ref_stride;
  }
  return total_sse;
}